

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_Extrusion::PathStart(ON_3dPoint *__return_storage_ptr__,ON_Extrusion *this)

{
  bool bVar1;
  ON_3dPoint local_30;
  double local_18;
  double t;
  ON_Extrusion *this_local;
  
  __return_storage_ptr__->x = ON_3dPoint::UnsetPoint.x;
  __return_storage_ptr__->y = ON_3dPoint::UnsetPoint.y;
  __return_storage_ptr__->z = ON_3dPoint::UnsetPoint.z;
  local_18 = (this->m_t).m_t[0];
  if (((0.0 <= local_18) && (local_18 <= 1.0)) &&
     (t = (double)this, bVar1 = ON_Line::IsValid(&this->m_path), bVar1)) {
    ON_Line::PointAt(&local_30,&this->m_path,local_18);
    __return_storage_ptr__->x = local_30.x;
    __return_storage_ptr__->y = local_30.y;
    __return_storage_ptr__->z = local_30.z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Extrusion::PathStart() const
{
  ON_3dPoint P(ON_3dPoint::UnsetPoint);
  const double t = m_t.m_t[0];
  if ( 0.0 <= t && t <= 1.0 && m_path.IsValid() )
    P = m_path.PointAt(t);
  return P;
}